

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::Buffer::BindRange
          (Buffer *this,GLuint index,GLintptr offset,GLsizeiptr size)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLsizeiptr size_local;
  GLintptr offset_local;
  GLuint index_local;
  Buffer *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  BindRange((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_buffer,index,offset,size);
  return;
}

Assistant:

void Buffer::BindRange(GLuint index, GLintptr offset, GLsizeiptr size) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	BindRange(gl, m_id, m_buffer, index, offset, size);
}